

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::VersionSet::Finalize(VersionSet *this,Version *v)

{
  pointer ppFVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  dVar9 = -1.0;
  uVar2 = 0xffffffff;
  uVar3 = 1;
  uVar4 = 0;
  do {
    if (uVar4 == 0) {
      lVar6 = (long)v->files_[0].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)v->files_[0].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar6 >> 3;
      auVar13._8_4_ = (int)(lVar6 >> 0x23);
      auVar13._0_8_ = lVar7;
      auVar13._12_4_ = 0x45300000;
      dVar10 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * 0.25;
    }
    else {
      ppFVar1 = v->files_[uVar4].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)v->files_[uVar4].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1;
      if (lVar6 == 0) {
        dVar10 = 0.0;
      }
      else {
        lVar6 = lVar6 >> 3;
        lVar8 = 0;
        lVar7 = 0;
        do {
          lVar7 = lVar7 + ppFVar1[lVar8]->file_size;
          lVar8 = lVar8 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
        auVar12._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar12._0_8_ = lVar7;
        auVar12._12_4_ = 0x45300000;
        dVar10 = (auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
      }
      dVar11 = 10485760.0;
      if (uVar4 != 1) {
        dVar11 = 10485760.0;
        uVar5 = uVar3;
        do {
          dVar11 = dVar11 * 10.0;
          uVar5 = uVar5 - 1;
        } while (2 < uVar5);
      }
      dVar10 = dVar10 / dVar11;
    }
    if (dVar9 < dVar10) {
      uVar2 = uVar4 & 0xffffffff;
      dVar9 = dVar10;
    }
    uVar4 = uVar4 + 1;
    uVar3 = uVar3 + 1;
  } while (uVar4 != 6);
  v->compaction_level_ = (int)uVar2;
  v->compaction_score_ = dVar9;
  return;
}

Assistant:

void VersionSet::Finalize(Version* v) {
  // Precomputed best level for next compaction
  int best_level = -1;
  double best_score = -1;

  for (int level = 0; level < config::kNumLevels - 1; level++) {
    double score;
    if (level == 0) {
      // We treat level-0 specially by bounding the number of files
      // instead of number of bytes for two reasons:
      //
      // (1) With larger write-buffer sizes, it is nice not to do too
      // many level-0 compactions.
      //
      // (2) The files in level-0 are merged on every read and
      // therefore we wish to avoid too many files when the individual
      // file size is small (perhaps because of a small write-buffer
      // setting, or very high compression ratios, or lots of
      // overwrites/deletions).
      score = v->files_[level].size() /
              static_cast<double>(config::kL0_CompactionTrigger);
    } else {
      // Compute the ratio of current size to size limit.
      const uint64_t level_bytes = TotalFileSize(v->files_[level]);
      score =
          static_cast<double>(level_bytes) / MaxBytesForLevel(options_, level);
    }

    if (score > best_score) {
      best_level = level;
      best_score = score;
    }
  }

  v->compaction_level_ = best_level;
  v->compaction_score_ = best_score;
}